

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.cpp
# Opt level: O0

Error uv11::write2(WriteRequest *req,Stream *stream,Buffer *bufs,uint nbufs,Stream *send_handle,
                  WriteCb *write_cb)

{
  uint uVar1;
  Buffer *pBVar2;
  uv_write_s *puVar3;
  uv_stream_t *puVar4;
  uv_stream_t *puVar5;
  _func_void_uv_write_t_ptr_int *p_Var6;
  error_code eVar7;
  Error EVar8;
  __0 local_4d;
  int local_4c;
  WriteCb *pWStack_48;
  int s;
  WriteCb *write_cb_local;
  Stream *send_handle_local;
  Buffer *pBStack_30;
  uint nbufs_local;
  Buffer *bufs_local;
  Stream *stream_local;
  WriteRequest *req_local;
  
  pWStack_48 = write_cb;
  write_cb_local = (WriteCb *)send_handle;
  send_handle_local._4_4_ = nbufs;
  pBStack_30 = bufs;
  bufs_local = (Buffer *)stream;
  stream_local = (Stream *)req;
  std::function<void_(uv11::WriteRequest_&,_std::error_code)>::operator=(&req->write_cb,write_cb);
  puVar3 = WrappedObject<uv_write_s>::Get((WrappedObject<uv_write_s> *)stream_local);
  puVar4 = Stream::GetStream((Stream *)bufs_local);
  pBVar2 = pBStack_30;
  uVar1 = send_handle_local._4_4_;
  puVar5 = Stream::GetStream((Stream *)write_cb_local);
  p_Var6 = write2(uv11::WriteRequest&,uv11::Stream&,uv11::Buffer_const*,unsigned_int,uv11::Stream&,std::function_const&)
           ::$_0::operator_cast_to_function_pointer(&local_4d);
  local_4c = uv_write2(puVar3,puVar4,pBVar2,uVar1,puVar5,p_Var6);
  if (local_4c != 0) {
    std::function<void_(uv11::WriteRequest_&,_std::error_code)>::operator=
              ((function<void_(uv11::WriteRequest_&,_std::error_code)> *)
               &stream_local[1].super_Handle.on_close,(nullptr_t)0x0);
  }
  eVar7 = make_error(local_4c);
  EVar8._M_cat = eVar7._M_cat;
  EVar8._M_value = eVar7._M_value;
  EVar8._4_4_ = 0;
  return EVar8;
}

Assistant:

Error uv11::write2(WriteRequest& req, Stream& stream, Buffer const bufs[], unsigned int nbufs,
    Stream& send_handle, WriteCb const& write_cb)
{
    req.write_cb = write_cb;
    int s = uv_write2(
        &req.Get(),
        &stream.GetStream(),
        bufs, nbufs,
        &send_handle.GetStream(),
        [] (uv_write_t* r, int status) {
            WriteRequest* w = reinterpret_cast<WriteRequest*>(r->data);
            auto w_cb = w->write_cb;
            w->write_cb = nullptr;
            w_cb(*w, make_error(status));
        }
    );

    if (s) req.write_cb = nullptr;

    return make_error(s);
}